

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void sparc_tr_init_disas_context(DisasContextBase *dcbase,CPUState *cs)

{
  uint uVar1;
  void *pvVar2;
  TranslationBlock *pTVar3;
  TranslationBlock *pTVar4;
  byte bVar5;
  int iVar6;
  
  pvVar2 = cs->env_ptr;
  dcbase[4].pc_next = (target_ulong)cs->uc;
  pTVar3 = dcbase->tb;
  pTVar4 = (TranslationBlock *)dcbase->pc_first;
  dcbase[1].tb = pTVar4;
  dcbase[1].pc_first = pTVar3->cs_base;
  *(undefined4 *)&dcbase[2].tb = 0;
  uVar1 = pTVar3->flags;
  dcbase[1].max_insns = uVar1 & 7;
  dcbase[2].pc_first = (long)pvVar2 + 0x2080;
  bVar5 = (byte)uVar1;
  dcbase[1].singlestep_enabled = (_Bool)(bVar5 >> 4 & 1);
  dcbase[1].field_0x25 = bVar5 >> 5 & 1;
  dcbase[1].field_0x26 = bVar5 >> 6 & 1;
  *(undefined4 *)&dcbase[4].pc_first = 0;
  *(uint *)((long)&dcbase[4].pc_first + 4) = uVar1 >> 0x18;
  iVar6 = (int)(-((ulong)pTVar4 | 0x3ffffe000) >> 2);
  if (dcbase->max_insns < iVar6) {
    iVar6 = dcbase->max_insns;
  }
  dcbase->max_insns = iVar6;
  return;
}

Assistant:

static void sparc_tr_init_disas_context(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    CPUSPARCState *env = cs->env_ptr;
    int bound;

    // unicorn setup
    dc->uc = cs->uc;

    dc->pc = dc->base.pc_first;
    dc->npc = (target_ulong)dc->base.tb->cs_base;
    dc->cc_op = CC_OP_DYNAMIC;
    dc->mem_idx = dc->base.tb->flags & TB_FLAG_MMU_MASK;
    dc->def = &env->def;
    dc->fpu_enabled = tb_fpu_enabled(dc->base.tb->flags);
    dc->address_mask_32bit = tb_am_enabled(dc->base.tb->flags);
    dc->supervisor = (dc->base.tb->flags & TB_FLAG_SUPER) != 0;
#ifdef TARGET_SPARC64
    dc->fprs_dirty = 0;
    dc->asi = (dc->base.tb->flags >> TB_FLAG_ASI_SHIFT) & 0xff;
#endif
    /*
     * if we reach a page boundary, we stop generation so that the
     * PC of a TT_TFAULT exception is always in the right page
     */
#ifdef _MSC_VER
    bound = (0 - (dc->base.pc_first | TARGET_PAGE_MASK)) / 4;
#else
    bound = -(dc->base.pc_first | TARGET_PAGE_MASK) / 4;
#endif
    dc->base.max_insns = MIN(dc->base.max_insns, bound);
}